

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NN.cpp
# Opt level: O0

int __thiscall NN::addnode(NN *this,int r,int c,int k)

{
  int iVar1;
  NeuronMat *this_00;
  reference ppNVar2;
  void *this_01;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  
  this_00 = (NeuronMat *)operator_new(0x48);
  NeuronMat::NeuronMat(this_00,in_ESI,in_EDX,in_ECX);
  iVar1 = *(int *)(in_RDI + 0x18) + 1;
  *(int *)(in_RDI + 0x18) = iVar1;
  ppNVar2 = std::vector<NeuronMat_*,_std::allocator<NeuronMat_*>_>::operator[]
                      ((vector<NeuronMat_*,_std::allocator<NeuronMat_*>_> *)(in_RDI + 0x30),
                       (long)iVar1);
  *ppNVar2 = this_00;
  this_01 = (void *)std::ostream::operator<<(&std::cout,*(int *)(in_RDI + 0x18));
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return *(int *)(in_RDI + 0x18);
}

Assistant:

int NN::addnode(int r, int c, int k) {
    neuron[++tot] = new NeuronMat(r, c, k);
    cout<<tot<<endl;
    return tot;
}